

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simMan.c
# Opt level: O1

void Sim_ManStop(Sim_Man_t *p)

{
  Vec_Vec_t *__ptr;
  void *__ptr_00;
  Vec_Ptr_t *__ptr_01;
  Vec_Int_t *__ptr_02;
  long lVar1;
  
  Sim_ManPrintStats(p);
  if (p->vSim0 != (Vec_Ptr_t *)0x0) {
    Sim_UtilInfoFree(p->vSim0);
  }
  if (p->vSim1 != (Vec_Ptr_t *)0x0) {
    Sim_UtilInfoFree(p->vSim1);
  }
  if (p->vSuppStr != (Vec_Ptr_t *)0x0) {
    Sim_UtilInfoFree(p->vSuppStr);
  }
  __ptr = p->vSuppTargs;
  if (__ptr != (Vec_Vec_t *)0x0) {
    if (0 < __ptr->nSize) {
      lVar1 = 0;
      do {
        __ptr_00 = __ptr->pArray[lVar1];
        if (__ptr_00 != (void *)0x0) {
          if (*(void **)((long)__ptr_00 + 8) != (void *)0x0) {
            free(*(void **)((long)__ptr_00 + 8));
            *(undefined8 *)((long)__ptr_00 + 8) = 0;
          }
          free(__ptr_00);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < __ptr->nSize);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (void **)0x0;
    }
    free(__ptr);
  }
  if (p->pMmPat != (Extra_MmFixed_t *)0x0) {
    Extra_MmFixedStop(p->pMmPat);
  }
  __ptr_01 = p->vFifo;
  if (__ptr_01 != (Vec_Ptr_t *)0x0) {
    if (__ptr_01->pArray != (void **)0x0) {
      free(__ptr_01->pArray);
      __ptr_01->pArray = (void **)0x0;
    }
    free(__ptr_01);
  }
  __ptr_02 = p->vDiffs;
  if (__ptr_02 != (Vec_Int_t *)0x0) {
    if (__ptr_02->pArray != (int *)0x0) {
      free(__ptr_02->pArray);
      __ptr_02->pArray = (int *)0x0;
    }
    free(__ptr_02);
  }
  if (p != (Sim_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Sim_ManStop( Sim_Man_t * p )
{
    Sim_ManPrintStats( p );
    if ( p->vSim0 )        Sim_UtilInfoFree( p->vSim0 );       
    if ( p->vSim1 )        Sim_UtilInfoFree( p->vSim1 );       
    if ( p->vSuppStr )     Sim_UtilInfoFree( p->vSuppStr );    
//    if ( p->vSuppFun )     Sim_UtilInfoFree( p->vSuppFun );    
    if ( p->vSuppTargs )   Vec_VecFree( p->vSuppTargs );
    if ( p->pMmPat )       Extra_MmFixedStop( p->pMmPat );
    if ( p->vFifo )        Vec_PtrFree( p->vFifo );
    if ( p->vDiffs )       Vec_IntFree( p->vDiffs );
    ABC_FREE( p );
}